

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcPrint.c
# Opt level: O0

void Mvc_CoverPrintBinary(Mvc_Cover_t *pCover)

{
  int local_1c;
  Mvc_Cube_t *pMStack_18;
  int i;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover_local;
  
  printf("The cover contains %d cubes (%d bits and %d words)\n",(ulong)(uint)(pCover->lCubes).nItems
         ,(ulong)(uint)pCover->nBits,(ulong)(uint)pCover->nWords);
  for (pMStack_18 = (pCover->lCubes).pHead; pMStack_18 != (Mvc_Cube_t *)0x0;
      pMStack_18 = pMStack_18->pNext) {
    Mvc_CubePrintBinary(pCover,pMStack_18);
  }
  if (pCover->pLits != (int *)0x0) {
    for (local_1c = 0; local_1c < pCover->nBits; local_1c = local_1c + 1) {
      printf(" %d",(ulong)(uint)pCover->pLits[local_1c]);
    }
    printf("\n");
  }
  printf("End of cover printout\n");
  return;
}

Assistant:

void Mvc_CoverPrintBinary( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int i;
    // print general statistics
    printf( "The cover contains %d cubes (%d bits and %d words)\n", 
        pCover->lCubes.nItems, pCover->nBits, pCover->nWords );
    // iterate through the cubes
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubePrintBinary( pCover, pCube );

    if ( pCover->pLits )
    {
        for ( i = 0; i < pCover->nBits; i++ )
            printf( " %d", pCover->pLits[i] );
        printf( "\n" ); 
    }
    printf( "End of cover printout\n" ); 
}